

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instance.cpp
# Opt level: O0

string * __thiscall
StringInstance::op_pushBack
          (StringInstance *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *arguments)

{
  char cVar1;
  bool bVar2;
  size_type sVar3;
  undefined8 *puVar4;
  const_reference pvVar5;
  char *pcVar6;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_RDX;
  long in_RSI;
  string *in_RDI;
  string *in_stack_ffffffffffffff78;
  allocator *paVar7;
  allocator local_4d [20];
  allocator local_39;
  string local_38 [32];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_18;
  
  local_18 = in_RDX;
  sVar3 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size(in_RDX);
  if (sVar3 != 1) {
    puVar4 = (undefined8 *)__cxa_allocate_exception(8);
    *puVar4 = "RuntimeError: wrong number of arguments.";
    __cxa_throw(puVar4,&char_const*::typeinfo,0);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator[](local_18,0);
  bVar2 = Grammar::is_character_value(in_stack_ffffffffffffff78);
  if (!bVar2) {
    puVar4 = (undefined8 *)__cxa_allocate_exception(8);
    *puVar4 = "RuntimeError: invalid argument.";
    __cxa_throw(puVar4,&char_const*::typeinfo,0);
  }
  pvVar5 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::operator[](local_18,0);
  pcVar6 = (char *)std::__cxx11::string::operator[]((ulong)pvVar5);
  cVar1 = *pcVar6;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_38,1,cVar1,&local_39);
  std::__cxx11::string::operator+=((string *)(in_RSI + 0x58),local_38);
  std::__cxx11::string::~string(local_38);
  std::allocator<char>::~allocator((allocator<char> *)&local_39);
  paVar7 = local_4d;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(in_RDI,"null",paVar7);
  std::allocator<char>::~allocator((allocator<char> *)local_4d);
  return in_RDI;
}

Assistant:

std::string StringInstance::op_pushBack(const std::vector<std::string>& arguments) {
    if (arguments.size() != 1)
        throw EXC_WRONG_NUMBER_OF_ARGUMENTS;
    if (!Grammar::is_character_value(arguments[0]))
        throw EXC_INVALID_ARGUMENT;
    _value += std::string(1, arguments[0][1]);
    return "null";
}